

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# day14a.cpp
# Opt level: O1

uint32_t day14a::get_index(string *input,int stretch)

{
  undefined8 *puVar1;
  char *key;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  char cVar5;
  value_type *__val;
  undefined8 *puVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  uint32_t uVar10;
  uint32_t unaff_R12D;
  ulong uVar11;
  char needle;
  uint32_t index;
  ulong uVar12;
  int iVar13;
  bool bVar14;
  ulong local_60;
  long local_58;
  long local_40;
  undefined8 *local_38;
  
  key = (input->_M_dataplus)._M_p;
  puVar6 = (undefined8 *)operator_new(40000);
  *puVar6 = 0;
  puVar6[1] = 0;
  puVar6[2] = 0;
  puVar6[3] = 0;
  puVar6[4] = 0;
  lVar9 = 0x28;
  do {
    *(undefined8 *)((long)puVar6 + lVar9 + 0x20) = puVar6[4];
    uVar2 = *puVar6;
    uVar3 = puVar6[1];
    uVar4 = puVar6[3];
    puVar1 = (undefined8 *)((long)puVar6 + lVar9 + 0x10);
    *puVar1 = puVar6[2];
    puVar1[1] = uVar4;
    *(undefined8 *)((long)puVar6 + lVar9) = uVar2;
    ((undefined8 *)((long)puVar6 + lVar9))[1] = uVar3;
    lVar9 = lVar9 + 0x28;
  } while (lVar9 != 40000);
  *(undefined4 *)puVar6 = 0xffffffff;
  local_40 = (long)puVar6 + 0x2c;
  uVar12 = 0;
  local_58 = 4;
  local_60 = 1;
  iVar13 = 0;
  local_38 = puVar6;
  do {
    local_38 = local_38 + 5;
    index = (uint32_t)uVar12;
    uVar11 = (ulong)(index + (int)((uVar12 & 0xffffffff) / 1000) * -1000);
    if (*(uint32_t *)(puVar6 + uVar11 * 5) != index) {
      hash_and_stretch(key,index,stretch,(MD5Cache *)(puVar6 + uVar11 * 5));
    }
    lVar9 = local_58 + (uVar12 / 1000) * -40000;
    lVar7 = 0;
    do {
      needle = *(char *)((long)puVar6 + lVar7 + lVar9);
      if ((*(char *)((long)puVar6 + lVar7 + lVar9 + 2) == needle) &&
         (*(char *)((long)puVar6 + lVar7 + lVar9 + 1) == needle)) goto LAB_0010d486;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x1e);
    needle = '\0';
LAB_0010d486:
    if (needle == '\0') {
LAB_0010d524:
      bVar14 = true;
      iVar8 = iVar13;
      uVar10 = unaff_R12D;
    }
    else {
      lVar9 = 0;
      uVar11 = local_60;
      do {
        if ((int)lVar9 == 40000) goto LAB_0010d524;
        lVar7 = (uVar11 / 1000) * -40000;
        if ((int)uVar11 != *(int *)((long)local_38 + lVar9 + lVar7)) {
          hash_and_stretch(key,(int)uVar11,stretch,(MD5Cache *)((long)local_38 + lVar9 + lVar7));
        }
        cVar5 = find_sequence<5>((char *)(lVar7 + local_40 + lVar9),needle);
        iVar8 = iVar13 + 1;
        bVar14 = iVar8 != 0x40;
        uVar10 = unaff_R12D;
        if (!bVar14) {
          uVar10 = index;
        }
        lVar9 = lVar9 + 0x28;
        uVar11 = uVar11 + 1;
      } while (cVar5 == '\0');
    }
    uVar12 = uVar12 + 1;
    local_58 = local_58 + 0x28;
    local_60 = local_60 + 1;
    local_40 = local_40 + 0x28;
    iVar13 = iVar8;
    unaff_R12D = uVar10;
    if (!bVar14) {
      operator_delete(puVar6,40000);
      return uVar10;
    }
  } while( true );
}

Assistant:

uint32_t get_index(const std::string& input, int stretch) {
		const char* key = input.c_str();
		std::vector<MD5Cache> hash_cache(1000);
		hash_cache[0].index = -1;
		for(int i = 0, found = 0;; ++i) {
			auto& hc = hash_cache[i % 1000];
			if(hc.index != i) {
				hash_and_stretch(key, i, stretch, hc);
			}
			char c = find_sequence<3>(hc.md5, 0);
			if(c != 0) {
				for(int j = i + 1; j <= i + 1000; ++j) {
					auto& hc = hash_cache[j % 1000];
					if(hc.index != j) {
						hash_and_stretch(key, j, stretch, hc);
					}
					if(find_sequence<5>(hc.md5, c)) {
						if(++found == 64) {
							return i;
						}
						break;
					}
				}
			}
		}
		return 0;
	}